

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

Model * __thiscall iDynTree::InverseKinematics::reducedModel(InverseKinematics *this)

{
  Model *pMVar1;
  InverseKinematics *in_RDI;
  
  missingIpoptErrorReport();
  pMVar1 = reducedModel(in_RDI);
  return pMVar1;
}

Assistant:

const Model& InverseKinematics::reducedModel() const
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->m_reducedVariablesInfo.reducedModel;
#else
        missingIpoptErrorReport();
        return this->reducedModel();
#endif
    }